

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

Super2_Lib_t * Super2_LibCompute(Super2_Man_t *pMan,Super2_Lib_t *pLib)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  stmm_table *psVar8;
  bool bVar9;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint local_64;
  uint uTruth2c;
  uint uTruth1c;
  uint uTruth2;
  uint uTruth1;
  uint uTruthR;
  uint uTruth;
  uint Mask;
  Super2_Gate_t **ppGate;
  Super2_Gate_t *pGateNew;
  Super2_Gate_t *pGate2;
  Super2_Gate_t *pGate1;
  Super2_Lib_t *pLibNew;
  Super2_Lib_t *pLib_local;
  Super2_Man_t *pMan_local;
  
  uVar1 = 0xffffffff >> (0x20U - (char)pLib->nMints & 0x1f);
  pLibNew = pLib;
  pLib_local = (Super2_Lib_t *)pMan;
  pGate1 = (Super2_Gate_t *)Super2_LibDup(pLib);
  stmm_free_table(*(stmm_table **)&pLib_local->nInputs);
  psVar8 = stmm_init_table(st__ptrcmp,st__ptrhash);
  *(stmm_table **)&pLib_local->nInputs = psVar8;
  pGate1->uTruth = 0;
  while( true ) {
    bVar9 = false;
    if ((int)pGate1->uTruth < *(int *)((long)&pGate1->pTwo + 4)) {
      pGate2 = *(Super2_Gate_t **)(*(long *)(pGate1 + 1) + (long)(int)pGate1->uTruth * 8);
      bVar9 = pGate2 != (Super2_Gate_t *)0x0;
    }
    if (!bVar9) {
      pLib_local->nLevels = *(int *)((long)&pGate1->pTwo + 4);
      pLibNew->i = 0;
      while( true ) {
        bVar9 = false;
        if (pLibNew->i < pLibNew->nGates) {
          pGate2 = pLibNew->pGates[pLibNew->i];
          bVar9 = pGate2 != (Super2_Gate_t *)0x0;
        }
        if (!bVar9) break;
        if ((pLibNew->i != 0) && (pLibNew->i % 300 == 0)) {
          printf("Tried %5d first gates...\n",(ulong)(uint)pLibNew->i);
          fflush(_stdout);
        }
        pLibNew->k = 0;
        while( true ) {
          bVar9 = false;
          if (pLibNew->k < pLibNew->i) {
            pGateNew = pLibNew->pGates[pLibNew->k];
            bVar9 = pGateNew != (Super2_Gate_t *)0x0;
          }
          if (!bVar9) break;
          uVar7 = pGate2->uTruth;
          uVar6 = pGateNew->uTruth;
          uVar2 = uVar1 & (uVar7 ^ 0xffffffff);
          uVar3 = uVar1 & (uVar6 ^ 0xffffffff);
          uVar4 = uVar7 & uVar6;
          local_6c = uVar4;
          if ((uVar4 & *(uint *)&pGate1[1].pOne) != 0) {
            local_6c = uVar1 & (uVar4 ^ 0xffffffff);
          }
          iVar5 = stmm_find_or_add(*(stmm_table **)&pLib_local->nInputs,(char *)(ulong)local_6c,
                                   (char ***)&uTruth);
          if (iVar5 == 0) {
            ppGate = (Super2_Gate_t **)Extra_MmFixedEntryFetch(*(Extra_MmFixed_t **)pLib_local);
            ((Super2_Gate_t *)ppGate)->pOne = pGate2;
            ((Super2_Gate_t *)ppGate)->pTwo = pGateNew;
            ((Super2_Gate_t *)ppGate)->uTruth = uVar4;
            *_uTruth = (char *)ppGate;
            Super2_LibAddGate((Super2_Lib_t *)pGate1,(Super2_Gate_t *)ppGate);
          }
          uVar6 = uVar2 & uVar6;
          local_70 = uVar6;
          if ((uVar6 & *(uint *)&pGate1[1].pOne) != 0) {
            local_70 = uVar1 & (uVar6 ^ 0xffffffff);
          }
          iVar5 = stmm_find_or_add(*(stmm_table **)&pLib_local->nInputs,(char *)(ulong)local_70,
                                   (char ***)&uTruth);
          if (iVar5 == 0) {
            ppGate = (Super2_Gate_t **)Extra_MmFixedEntryFetch(*(Extra_MmFixed_t **)pLib_local);
            ((Super2_Gate_t *)ppGate)->pOne = (Super2_Gate_t *)((ulong)pGate2 ^ 1);
            ((Super2_Gate_t *)ppGate)->pTwo = pGateNew;
            ((Super2_Gate_t *)ppGate)->uTruth = uVar6;
            *_uTruth = (char *)ppGate;
            Super2_LibAddGate((Super2_Lib_t *)pGate1,(Super2_Gate_t *)ppGate);
          }
          uVar7 = uVar7 & uVar3;
          local_74 = uVar7;
          if ((uVar7 & *(uint *)&pGate1[1].pOne) != 0) {
            local_74 = uVar1 & (uVar7 ^ 0xffffffff);
          }
          iVar5 = stmm_find_or_add(*(stmm_table **)&pLib_local->nInputs,(char *)(ulong)local_74,
                                   (char ***)&uTruth);
          if (iVar5 == 0) {
            ppGate = (Super2_Gate_t **)Extra_MmFixedEntryFetch(*(Extra_MmFixed_t **)pLib_local);
            ((Super2_Gate_t *)ppGate)->pOne = pGate2;
            ((Super2_Gate_t *)ppGate)->pTwo = (Super2_Gate_t *)((ulong)pGateNew ^ 1);
            ((Super2_Gate_t *)ppGate)->uTruth = uVar7;
            *_uTruth = (char *)ppGate;
            Super2_LibAddGate((Super2_Lib_t *)pGate1,(Super2_Gate_t *)ppGate);
          }
          uVar2 = uVar2 & uVar3;
          local_78 = uVar2;
          if ((uVar2 & *(uint *)&pGate1[1].pOne) != 0) {
            local_78 = uVar1 & (uVar2 ^ 0xffffffff);
          }
          iVar5 = stmm_find_or_add(*(stmm_table **)&pLib_local->nInputs,(char *)(ulong)local_78,
                                   (char ***)&uTruth);
          if (iVar5 == 0) {
            ppGate = (Super2_Gate_t **)Extra_MmFixedEntryFetch(*(Extra_MmFixed_t **)pLib_local);
            ((Super2_Gate_t *)ppGate)->pOne = (Super2_Gate_t *)((ulong)pGate2 ^ 1);
            ((Super2_Gate_t *)ppGate)->pTwo = (Super2_Gate_t *)((ulong)pGateNew ^ 1);
            ((Super2_Gate_t *)ppGate)->uTruth = uVar2;
            *_uTruth = (char *)ppGate;
            Super2_LibAddGate((Super2_Lib_t *)pGate1,(Super2_Gate_t *)ppGate);
          }
          pLib_local->nLevels = pLib_local->nLevels + 4;
          pLibNew->k = pLibNew->k + 1;
        }
        pLibNew->i = pLibNew->i + 1;
      }
      return (Super2_Lib_t *)pGate1;
    }
    if ((pGate2->uTruth & *(uint *)&pGate1[1].pOne) == 0) {
      local_64 = pGate2->uTruth;
    }
    else {
      local_64 = uVar1 & (pGate2->uTruth ^ 0xffffffff);
    }
    iVar5 = stmm_lookup(*(stmm_table **)&pLib_local->nInputs,(char *)(ulong)local_64,
                        (char **)&pGateNew);
    if (iVar5 != 0) break;
    stmm_insert(*(stmm_table **)&pLib_local->nInputs,(char *)(ulong)local_64,(char *)pGate2);
    pGate1->uTruth = pGate1->uTruth + 1;
  }
  printf("New gate:\n");
  Super2_LibWriteGate((FILE *)_stdout,(Super2_Lib_t *)pGate1,pGate2);
  printf("Gate in the table:\n");
  Super2_LibWriteGate((FILE *)_stdout,(Super2_Lib_t *)pGate1,pGateNew);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/super/superAnd.c"
                ,0x167,"Super2_Lib_t *Super2_LibCompute(Super2_Man_t *, Super2_Lib_t *)");
}

Assistant:

Super2_Lib_t * Super2_LibCompute( Super2_Man_t * pMan, Super2_Lib_t * pLib )
{
    Super2_Lib_t * pLibNew;
    Super2_Gate_t * pGate1, * pGate2, * pGateNew;
    Super2_Gate_t ** ppGate;
    unsigned Mask = SUPER_MASK(pLib->nMints);
    unsigned uTruth, uTruthR, uTruth1, uTruth2, uTruth1c, uTruth2c;

    // start the new library
    pLibNew = Super2_LibDup( pLib );

    // reset the hash table
    stmm_free_table( pMan->tTable );
    pMan->tTable = stmm_init_table( st__ptrcmp, st__ptrhash );
    // set the starting things into the hash table
    Super2_LibForEachGate( pLibNew, pGate1 )
    {
        uTruthR = ((pGate1->uTruth & pLibNew->uMaskBit)? Mask & ~pGate1->uTruth : pGate1->uTruth);

        if ( stmm_lookup( pMan->tTable, (char *)(ABC_PTRUINT_T)uTruthR, (char **)&pGate2 ) )
        {
            printf( "New gate:\n" );
            Super2_LibWriteGate( stdout, pLibNew, pGate1 );
            printf( "Gate in the table:\n" );
            Super2_LibWriteGate( stdout, pLibNew, pGate2 );
            assert( 0 );
        }
        stmm_insert( pMan->tTable, (char *)(ABC_PTRUINT_T)uTruthR, (char *)(ABC_PTRUINT_T)pGate1 );
    }


    // set the number of gates tried
    pMan->nTried = pLibNew->nGates;

    // go through the gate pairs
    Super2_LibForEachGate( pLib, pGate1 )
    {
        if ( pLib->i && pLib->i % 300 == 0 )
        {
            printf( "Tried %5d first gates...\n", pLib->i );
            fflush( stdout );
        }

        Super2_LibForEachGate2( pLib, pGate2 )
        {
            uTruth1  = pGate1->uTruth;
            uTruth2  = pGate2->uTruth;
            uTruth1c = Mask & ~uTruth1;
            uTruth2c = Mask & ~uTruth2;

            // none complemented
            uTruth  = uTruth1  & uTruth2;
            uTruthR = ((uTruth & pLibNew->uMaskBit)? Mask & ~uTruth : uTruth);

            if ( !stmm_find_or_add( pMan->tTable, (char *)(ABC_PTRUINT_T)uTruthR, (char ***)&ppGate ) )
            {
                pGateNew = (Super2_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
                pGateNew->pOne  = pGate1;
                pGateNew->pTwo  = pGate2;
                pGateNew->uTruth = uTruth;
                *ppGate = pGateNew;
                Super2_LibAddGate( pLibNew, pGateNew );
            }                

            // one complemented
            uTruth  = uTruth1c & uTruth2;
            uTruthR = ((uTruth & pLibNew->uMaskBit)? Mask & ~uTruth : uTruth);

            if ( !stmm_find_or_add( pMan->tTable, (char *)(ABC_PTRUINT_T)uTruthR, (char ***)&ppGate ) )
            {
                pGateNew = (Super2_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
                pGateNew->pOne  = Super2_Not(pGate1);
                pGateNew->pTwo  = pGate2;
                pGateNew->uTruth = uTruth;
                *ppGate = pGateNew;
                Super2_LibAddGate( pLibNew, pGateNew );
            }                

            // another complemented
            uTruth  = uTruth1  & uTruth2c;
            uTruthR = ((uTruth & pLibNew->uMaskBit)? Mask & ~uTruth : uTruth);

            if ( !stmm_find_or_add( pMan->tTable, (char *)(ABC_PTRUINT_T)uTruthR, (char ***)&ppGate ) )
            {
                pGateNew = (Super2_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
                pGateNew->pOne  = pGate1;
                pGateNew->pTwo  = Super2_Not(pGate2);
                pGateNew->uTruth = uTruth;
                *ppGate = pGateNew;
                Super2_LibAddGate( pLibNew, pGateNew );
            }                

            // both complemented
            uTruth  = uTruth1c & uTruth2c;
            uTruthR = ((uTruth & pLibNew->uMaskBit)? Mask & ~uTruth : uTruth);

            if ( !stmm_find_or_add( pMan->tTable, (char *)(ABC_PTRUINT_T)uTruthR, (char ***)&ppGate ) )
            {
                pGateNew = (Super2_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
                pGateNew->pOne  = Super2_Not(pGate1);
                pGateNew->pTwo  = Super2_Not(pGate2);
                pGateNew->uTruth = uTruth;
                *ppGate = pGateNew;
                Super2_LibAddGate( pLibNew, pGateNew );
            }                

            pMan->nTried += 4;
        }
    }
    return pLibNew;
}